

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.hpp
# Opt level: O0

unique_pointer<const_pstore::repo::fragment> __thiscall
pstore::database::getrou<pstore::repo::fragment,void>
          (database *this,extent<pstore::repo::fragment> *ex)

{
  value_type vVar1;
  address size;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_RDX;
  _Head_base<0UL,_const_pstore::repo::fragment_*,_false> extraout_RDX;
  unique_pointer<const_pstore::repo::fragment> uVar2;
  address local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  extent<pstore::repo::fragment> *ex_local;
  database *this_local;
  
  local_20._M_pi = in_RDX;
  ex_local = ex;
  this_local = this;
  local_28 = typed_address<pstore::repo::fragment>::to_address
                       ((typed_address<pstore::repo::fragment> *)in_RDX);
  vVar1 = address::absolute(&stack0xffffffffffffffd8);
  if ((vVar1 & 0xf) != 0) {
    raise<pstore::error_code>(bad_alignment);
  }
  size = typed_address<pstore::repo::fragment>::to_address
                   ((typed_address<pstore::repo::fragment> *)local_20._M_pi);
  getrou((database *)&stack0xffffffffffffffc8,(address)ex,size.a_);
  unique_pointer_cast<pstore::repo::fragment_const,void_const>
            ((pstore *)this,(unique_pointer<const_void> *)&stack0xffffffffffffffc8);
  std::unique_ptr<const_void,_void_(*)(const_void_*)>::~unique_ptr
            ((unique_ptr<const_void,_void_(*)(const_void_*)> *)&stack0xffffffffffffffc8);
  uVar2._M_t.
  super___uniq_ptr_impl<const_pstore::repo::fragment,_void_(*)(const_pstore::repo::fragment_*)>._M_t
  .super__Tuple_impl<0UL,_const_pstore::repo::fragment_*,_void_(*)(const_pstore::repo::fragment_*)>.
  super__Head_base<0UL,_const_pstore::repo::fragment_*,_false>._M_head_impl =
       extraout_RDX._M_head_impl;
  uVar2._M_t.
  super___uniq_ptr_impl<const_pstore::repo::fragment,_void_(*)(const_pstore::repo::fragment_*)>._M_t
  .super__Tuple_impl<0UL,_const_pstore::repo::fragment_*,_void_(*)(const_pstore::repo::fragment_*)>.
  super__Tuple_impl<1UL,_void_(*)(const_pstore::repo::fragment_*)>.
  super__Head_base<1UL,_void_(*)(const_pstore::repo::fragment_*),_false>._M_head_impl =
       (_Head_base<1UL,_void_(*)(const_pstore::repo::fragment_*),_false>)
       (_Head_base<1UL,_void_(*)(const_pstore::repo::fragment_*),_false>)this;
  return (unique_pointer<const_pstore::repo::fragment>)
         uVar2._M_t.
         super___uniq_ptr_impl<const_pstore::repo::fragment,_void_(*)(const_pstore::repo::fragment_*)>
         ._M_t.
         super__Tuple_impl<0UL,_const_pstore::repo::fragment_*,_void_(*)(const_pstore::repo::fragment_*)>
  ;
}

Assistant:

auto database::getrou (extent<T> const & ex) const -> unique_pointer<T const> {
        if (ex.addr.to_address ().absolute () % alignof (T) != 0) {
            raise (error_code::bad_alignment);
        }
        // ex.size specifies the size in bytes of the data to be loaded, not the number of elements
        // of type T. For this reason we call the plain address version of getro().
        return unique_pointer_cast<T const> (this->getrou (ex.addr.to_address (), ex.size));
    }